

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O0

void __thiscall CVmObjBigNum::wp8(CVmObjBigNum *this,char *buf,int *ov)

{
  int iVar1;
  undefined4 *in_RDX;
  uchar *in_RSI;
  long in_RDI;
  int *unaff_retaddr;
  char *in_stack_00000008;
  
  wp8abs((CVmObjBigNum *)ov,in_stack_00000008,unaff_retaddr);
  iVar1 = get_neg(*(char **)(in_RDI + 8));
  if (iVar1 != 0) {
    *in_RDX = 1;
    twos_complement_p8(in_RSI);
  }
  return;
}

Assistant:

void CVmObjBigNum::wp8(char *buf, int &ov) const
{
    /* generate the absolute value */
    wp8abs(buf, ov);

    /* 
     *   if the value is negative, we can't represent it as unsigned; take
     *   the two's complement in case they want the truncated version of the
     *   value, and set the overflow flag 
     */
    if (get_neg(ext_))
    {
        ov = TRUE;
        twos_complement_p8((unsigned char *)buf);
    }
}